

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Oscilloscope.cpp
# Opt level: O0

int Oscilloscope::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  EffectData *pEVar1;
  float *pfVar2;
  float fVar3;
  float local_78;
  int local_70;
  float a;
  int n_1;
  float specdecay;
  int n;
  float f;
  float s;
  float c;
  int w;
  int windowsize;
  HistoryBuffer *spectrum;
  HistoryBuffer *history;
  int i_1;
  int i;
  EffectData *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<Oscilloscope::EffectData>(state);
  memcpy(outbuffer,inbuffer,(ulong)length * 4 * (long)inchannels);
  for (history._4_4_ = 0; history._4_4_ < inchannels; history._4_4_ = history._4_4_ + 1) {
    HistoryBuffer::Feed((HistoryBuffer *)(pEVar1->p + (long)history._4_4_ * 4 + 4),
                        inbuffer + history._4_4_,length,inchannels);
  }
  if (1.0 <= pEVar1->p[2]) {
    for (history._0_4_ = 0; (int)history < inchannels; history._0_4_ = (int)history + 1) {
      pfVar2 = pEVar1->p + (long)(int)history * 4 + 4;
      s = pfVar2[1];
      f = 1.0;
      n = 0;
      fVar3 = sinf(0.0007669904);
      memset(pEVar1->fftbuf,0,0x10000);
      for (n_1 = 0; n_1 < 0x1000; n_1 = n_1 + 1) {
        pEVar1->fftbuf[n_1].re =
             *(float *)(*(long *)(pfVar2 + 2) + (long)(int)s * 4) * (f * -0.5 + 0.5);
        n = (int)(f * fVar3 * 2.0 + (float)n);
        f = -(float)n * fVar3 * 2.0 + f;
        s = (float)((int)s + -1);
        if ((int)s < 0) {
          s = (float)((int)*pfVar2 + -1);
        }
      }
      FFT::Forward(pEVar1->fftbuf,0x2000,true);
      fVar3 = powf(10.0,(pEVar1->p[3] * 0.05 * (float)length) /
                        (float)(state->field_0).field_0.samplerate);
      for (local_70 = 0; local_70 < 0x1000; local_70 = local_70 + 1) {
        local_78 = UnityComplexNumberT<float>::Magnitude(pEVar1->fftbuf + local_70);
        pfVar2 = pEVar1->smoothspec[(int)history] + local_70;
        if (local_78 < *pfVar2 || local_78 == *pfVar2) {
          local_78 = pEVar1->smoothspec[(int)history][local_70] * fVar3;
        }
        pEVar1->smoothspec[(int)history][local_70] = local_78;
      }
      HistoryBuffer::Feed((HistoryBuffer *)(&pEVar1->field_0x90 + (long)(int)history * 0x10),
                          pEVar1->smoothspec[(int)history],0x1000,1);
    }
  }
  pEVar1->numchannels = inchannels;
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);

        for (int i = 0; i < inchannels; i++)
            data->history[i].Feed(inbuffer + i, length, inchannels);

        if (data->p[P_Mode] >= 1.0f)
        {
            for (int i = 0; i < inchannels; i++)
            {
                HistoryBuffer& history = data->history[i];
                HistoryBuffer& spectrum = data->spectrum[i];
                int windowsize = FFTSIZE / 2;
                int w = history.writeindex;
                float c = 1.0f, s = 0.0f, f = 2.0f * sinf(kPI / (float)windowsize);
                memset(data->fftbuf, 0, sizeof(UnityComplexNumber) * FFTSIZE);
                for (int n = 0; n < windowsize; n++)
                {
                    data->fftbuf[n].re = history.data[w] * (0.5f - 0.5f * c);
                    s += c * f;
                    c -= s * f;
                    if (--w < 0)
                        w = history.length - 1;
                }
                FFT::Forward(data->fftbuf, FFTSIZE, true);
                float specdecay = powf(10.0f, 0.05f * data->p[P_SpectrumDecay] * length / (float)state->samplerate);
                for (int n = 0; n < FFTSIZE / 2; n++)
                {
                    float a = data->fftbuf[n].Magnitude();
                    data->smoothspec[i][n] = (a > data->smoothspec[i][n]) ? a : data->smoothspec[i][n] * specdecay;
                }
                spectrum.Feed(data->smoothspec[i], FFTSIZE / 2, 1);
            }
        }

        data->numchannels = inchannels;

        return UNITY_AUDIODSP_OK;
    }